

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

int __thiscall QComboBox::findData(QComboBox *this,QVariant *data,int role,MatchFlags flags)

{
  undefined4 uVar1;
  long lVar2;
  long *plVar3;
  int *piVar4;
  int iVar5;
  long in_FS_OFFSET;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  plVar3 = *(long **)(lVar2 + 0x298);
  uVar1 = *(undefined4 *)(lVar2 + 0x344);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            (&local_78,(QPersistentModelIndex *)(lVar2 + 0x2c0));
  (**(code **)(*plVar3 + 0x60))(&local_58,plVar3,0,uVar1,&local_78);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.r = -0x55555556;
  local_78.c = -0x55555556;
  local_78.i._0_4_ = 0xaaaaaaaa;
  local_78.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(lVar2 + 0x298) + 0x150))
            (&local_78,*(long **)(lVar2 + 0x298),&local_58,role,data,1,
             flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i)
  ;
  if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = *(int *)CONCAT44(local_78.i._4_4_,(undefined4)local_78.i);
  }
  piVar4 = (int *)CONCAT44(local_78.c,local_78.r);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.c,local_78.r),0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QComboBox::findData(const QVariant &data, int role, Qt::MatchFlags flags) const
{
    Q_D(const QComboBox);
    QModelIndex start = d->model->index(0, d->modelColumn, d->root);
    const QModelIndexList result = d->model->match(start, role, data, 1, flags);
    if (result.isEmpty())
        return -1;
    return result.first().row();
}